

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O2

void __thiscall
amrex::BndryData::BndryData
          (BndryData *this,BoxArray *_grids,DistributionMapping *_dmap,int _ncomp,Geometry *_geom)

{
  BndryRegister::BndryRegister(&this->super_BndryRegister);
  (this->super_BndryRegister)._vptr_BndryRegister = (_func_int **)&PTR__BndryData_007d6c30;
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  ::LayoutData(&this->bcond);
  LayoutData<std::array<double,_6UL>_>::LayoutData(&this->bcloc);
  (this->masks).super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
  super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->masks).super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
  super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->masks).super_vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>.
  super__Vector_base<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memcpy(&this->geom,_geom,200);
  this->m_ncomp = _ncomp;
  this->m_defined = false;
  define(this,_grids,_dmap,_ncomp,_geom);
  return;
}

Assistant:

BndryData::BndryData (const BoxArray& _grids,
                      const DistributionMapping& _dmap,
                      int             _ncomp,
                      const Geometry& _geom)
    :
    geom(_geom),
    m_ncomp(_ncomp),
    m_defined(false)
{
    define(_grids,_dmap,_ncomp,_geom);
}